

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

bool __thiscall Hospital::validate_String_Must_Be_character(Hospital *this,string *name)

{
  ulong uVar1;
  byte *pbVar2;
  bool bVar3;
  ulong uVar4;
  byte bVar5;
  
  uVar1 = name->_M_string_length;
  if (uVar1 == 0) {
LAB_001203e4:
    bVar3 = true;
  }
  else {
    pbVar2 = (byte *)(name->_M_dataplus)._M_p;
    bVar5 = *pbVar2;
    if ((char)bVar5 < 'A') {
      bVar3 = false;
    }
    else {
      uVar4 = 1;
      bVar3 = false;
      do {
        if (0x19 < (byte)(bVar5 + 0x9f) && 0x5a < bVar5) {
          return bVar3;
        }
        if (uVar1 == uVar4) goto LAB_001203e4;
        bVar3 = uVar1 <= uVar4;
        bVar5 = pbVar2[uVar4];
        uVar4 = uVar4 + 1;
      } while ('@' < (char)bVar5);
    }
  }
  return bVar3;
}

Assistant:

bool Hospital::validate_String_Must_Be_character(string name) {
    int countr = 0;
    for (int i = 0; i <name.length() ; ++i) {
        if((name[i]>=65 && name[i]<=90) || (name[i]>=97 && name[i]<=122) )countr ++;
        else {
            return false;
        }
    }
    if(countr == name.length())return true ;
}